

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<bool>::relocate(QArrayDataPointer<bool> *this,qsizetype offset,bool **data)

{
  bool bVar1;
  bool *first;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<bool> *in_RDI;
  bool **unaff_retaddr;
  bool *res;
  QArrayDataPointer<bool> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<bool,long_long>(first,(longlong)in_RDI,(bool *)0x11cda0);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::q_points_into_range<QArrayDataPointer<bool>,bool_const*>(unaff_retaddr,c),
     bVar1)) {
    *in_RDX = in_RSI + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }